

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void djb::spline::uwrap_repeat(float_t u,int s,int *x,int *y,float_t *w)

{
  int iVar1;
  float_t fVar2;
  float x_00;
  double dVar3;
  float local_2c;
  float_t frac;
  float_t intpart;
  float_t *w_local;
  int *y_local;
  int *x_local;
  int s_local;
  float_t u_local;
  
  _frac = w;
  w_local = (float_t *)y;
  y_local = x;
  x_local._0_4_ = s;
  x_local._4_4_ = u;
  dVar3 = std::modf((double)(ulong)(uint)(u * (float)s),(double *)&local_2c);
  x_00 = SUB84(dVar3,0);
  iVar1 = iwrap_repeat((int)local_2c,(int)x_local);
  *y_local = iVar1;
  iVar1 = sgn<float>(x_00);
  fVar2 = (float_t)iwrap_repeat((int)local_2c + iVar1,(int)x_local);
  *w_local = fVar2;
  iVar1 = sgn<float>(x_00);
  *_frac = x_00 * (float)iVar1;
  return;
}

Assistant:

void uwrap_repeat(float_t u, int s, int *x, int *y, float_t *w)
{
	float_t intpart; float_t frac = modf(u * s, &intpart);
	(*x) = iwrap_repeat((int)intpart            , s);
	(*y) = iwrap_repeat((int)intpart + sgn(frac), s);
	(*w) = frac * sgn(frac);
}